

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImDrawList * GetViewportDrawList(ImGuiViewportP *viewport,size_t drawlist_no,char *drawlist_name)

{
  int *piVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  ImDrawList *this;
  ImGuiContext *ctx;
  ImVec2 local_38;
  
  pIVar4 = GImGui;
  this = viewport->DrawLists[drawlist_no];
  if (this == (ImDrawList *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    this = (ImDrawList *)(*GImAllocatorAllocFunc)(200,GImAllocatorUserData);
    (this->_Splitter)._Channels.Size = 0;
    (this->_Splitter)._Channels.Capacity = 0;
    (this->_Splitter)._Channels.Data = (ImDrawChannel *)0x0;
    (this->CmdBuffer).Size = 0;
    (this->CmdBuffer).Capacity = 0;
    (this->CmdBuffer).Data = (ImDrawCmd *)0x0;
    (this->IdxBuffer).Size = 0;
    (this->IdxBuffer).Capacity = 0;
    (this->IdxBuffer).Data = (unsigned_short *)0x0;
    (this->VtxBuffer).Size = 0;
    (this->VtxBuffer).Capacity = 0;
    (this->VtxBuffer).Data = (ImDrawVert *)0x0;
    (this->_ClipRectStack).Size = 0;
    (this->_ClipRectStack).Capacity = 0;
    (this->_ClipRectStack).Data = (ImVec4 *)0x0;
    (this->_TextureIdStack).Size = 0;
    (this->_TextureIdStack).Capacity = 0;
    (this->_TextureIdStack).Data = (void **)0x0;
    (this->_Path).Size = 0;
    (this->_Path).Capacity = 0;
    (this->_Path).Data = (ImVec2 *)0x0;
    (this->_CmdHeader).ClipRect.x = 0.0;
    (this->_CmdHeader).ClipRect.y = 0.0;
    (this->_CmdHeader).ClipRect.z = 0.0;
    (this->_CmdHeader).ClipRect.w = 0.0;
    (this->_Splitter)._Current = 0;
    (this->_Splitter)._Count = 0;
    (this->_Splitter)._Channels.Size = 0;
    (this->_Splitter)._Channels.Capacity = 0;
    (this->_Splitter)._Channels.Data = (ImDrawChannel *)0x0;
    memset(this,0,200);
    this->_Data = &pIVar4->DrawListSharedData;
    this->_OwnerName = drawlist_name;
    viewport->DrawLists[drawlist_no] = this;
  }
  if (viewport->DrawListsLastFrame[drawlist_no] != pIVar4->FrameCount) {
    ImDrawList::_ResetForNewFrame(this);
    ImDrawList::PushTextureID(this,((pIVar4->IO).Fonts)->TexID);
    IVar2 = (viewport->super_ImGuiViewport).Pos;
    IVar3 = (viewport->super_ImGuiViewport).Size;
    local_38.x = IVar3.x + IVar2.x;
    local_38.y = IVar3.y + IVar2.y;
    ImDrawList::PushClipRect(this,&(viewport->super_ImGuiViewport).Pos,&local_38,false);
    viewport->DrawListsLastFrame[drawlist_no] = pIVar4->FrameCount;
  }
  return this;
}

Assistant:

static ImDrawList* GetViewportDrawList(ImGuiViewportP* viewport, size_t drawlist_no, const char* drawlist_name)
{
    // Create the draw list on demand, because they are not frequently used for all viewports
    ImGuiContext& g = *GImGui;
    IM_ASSERT(drawlist_no < IM_ARRAYSIZE(viewport->DrawLists));
    ImDrawList* draw_list = viewport->DrawLists[drawlist_no];
    if (draw_list == NULL)
    {
        draw_list = IM_NEW(ImDrawList)(&g.DrawListSharedData);
        draw_list->_OwnerName = drawlist_name;
        viewport->DrawLists[drawlist_no] = draw_list;
    }

    // Our ImDrawList system requires that there is always a command
    if (viewport->DrawListsLastFrame[drawlist_no] != g.FrameCount)
    {
        draw_list->_ResetForNewFrame();
        draw_list->PushTextureID(g.IO.Fonts->TexID);
        draw_list->PushClipRect(viewport->Pos, viewport->Pos + viewport->Size, false);
        viewport->DrawListsLastFrame[drawlist_no] = g.FrameCount;
    }
    return draw_list;
}